

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<char_const*>::insert<char_const**,void>
          (SmallVectorImpl<char_const*> *this,iterator I,char **From,char **To)

{
  move_iterator<const_char_**> in_end;
  iterator ppcVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  iterator __src;
  ulong uVar6;
  
  ppcVar1 = *(iterator *)this;
  lVar5 = (long)I - (long)ppcVar1;
  uVar2 = (ulong)*(uint *)(this + 8);
  if (ppcVar1 + uVar2 == I) {
    append<char_const**,void>(this,From,To);
    __src = (iterator)(lVar5 + *(long *)this);
  }
  else {
    if (I < ppcVar1) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    if (ppcVar1 + uVar2 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    uVar4 = (long)To - (long)From >> 3;
    if ((ulong)*(uint *)(this + 0xc) < uVar2 + uVar4) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,uVar2 + uVar4,8);
      ppcVar1 = *(iterator *)this;
      uVar2 = (ulong)*(uint *)(this + 8);
    }
    __src = (iterator)((long)ppcVar1 + lVar5);
    in_end._M_current = ppcVar1 + uVar2;
    sVar3 = uVar2 * 8 - lVar5;
    uVar6 = (long)sVar3 >> 3;
    if (uVar6 < uVar4) {
      uVar4 = uVar4 + uVar2;
      if (*(uint *)(this + 0xc) < uVar4) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      *(int *)(this + 8) = (int)uVar4;
      if (uVar2 * 8 - lVar5 != 0) {
        memcpy(ppcVar1 + (uVar4 - uVar6),__src,sVar3);
        lVar5 = 0;
        uVar2 = 0;
        do {
          __src[uVar2] = From[uVar2];
          uVar2 = uVar2 + 1;
          lVar5 = lVar5 + -8;
        } while (uVar6 != uVar2);
        From = (char **)((long)From - lVar5);
      }
      if (From != To) {
        memcpy(in_end._M_current,From,(long)To - (long)From);
      }
    }
    else {
      append<std::move_iterator<char_const**>,void>
                (this,(move_iterator<const_char_**>)(in_end._M_current + -uVar4),in_end);
      sVar3 = (long)(in_end._M_current + -uVar4) - (long)__src;
      if (sVar3 != 0) {
        memmove((void *)((long)in_end._M_current - sVar3),__src,sVar3);
      }
      if (To != From) {
        ppcVar1 = (iterator)memmove(__src,From,(long)To - (long)From);
        return ppcVar1;
      }
    }
  }
  return __src;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }